

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_throttle_all_channels(ConnectionLayer *cl,_Bool throttled)

{
  ssh2_channel *c_00;
  int local_2c;
  int i;
  ssh2_channel *c;
  ssh2_connection_state *s;
  _Bool throttled_local;
  ConnectionLayer *cl_local;
  
  *(_Bool *)&cl[-8].vt = throttled;
  local_2c = 0;
  while( true ) {
    c_00 = (ssh2_channel *)index234((tree234 *)cl[-8].logctx,local_2c);
    if (c_00 == (ssh2_channel *)0x0) break;
    if (c_00->sharectx == (ssh_sharing_connstate *)0x0) {
      ssh2_channel_check_throttle(c_00);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void ssh2_throttle_all_channels(ConnectionLayer *cl, bool throttled)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh2_channel *c;
    int i;

    s->all_channels_throttled = throttled;

    for (i = 0; NULL != (c = index234(s->channels, i)); i++)
        if (!c->sharectx)
            ssh2_channel_check_throttle(c);
}